

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

pair<_3562ccc5_> __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>>>
::
emplace_new_key<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>
          (sherwood_v3_table<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>
          *key)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  tuple<slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
  tVar4;
  _Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
  _Var5;
  undefined8 uVar6;
  long lVar7;
  EntryPointer psVar8;
  long lVar9;
  char cVar10;
  undefined8 unaff_RBP;
  undefined7 uVar12;
  ulong uVar11;
  EntryPointer psVar13;
  char __tmp_1;
  sherwood_v3_table<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>>>
  sVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  pair<_3562ccc5_> pVar17;
  value_type to_insert;
  undefined1 local_60 [32];
  _Head_base<0UL,_slang::SourceManager::FileData_*,_false> local_40;
  anon_union_40_1_a8c68091_for_sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>_3
  *local_38;
  
  if ((*(long *)(this + 8) != 0) &&
     (this[0x11] !=
      (sherwood_v3_table<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>>>
       )distance_from_desired)) {
    lVar9 = *(long *)(this + 0x18) + 1;
    auVar15._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar15._0_8_ = lVar9;
    auVar15._12_4_ = 0x45300000;
    lVar7 = *(long *)(this + 8) + 1;
    auVar16._8_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar16._0_8_ = lVar7;
    auVar16._12_4_ = 0x45300000;
    if ((auVar15._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0) <=
        (double)*(float *)(this + 0x14) *
        ((auVar16._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) {
      paVar1 = &(key->first).field_2;
      uVar12 = (undefined7)((ulong)unaff_RBP >> 8);
      if (current_entry->distance_from_desired < '\0') {
        paVar2 = &(current_entry->field_1).value.first.field_2;
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)&current_entry->field_1 = paVar2;
        pcVar3 = (key->first)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 == paVar1) {
          uVar6 = *(undefined8 *)((long)&(key->first).field_2 + 8);
          paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
          *(undefined8 *)((long)&(current_entry->field_1).value.first.field_2 + 8) = uVar6;
        }
        else {
          (current_entry->field_1).value.first._M_dataplus._M_p = pcVar3;
          (current_entry->field_1).value.first.field_2._M_allocated_capacity =
               paVar1->_M_allocated_capacity;
        }
        (current_entry->field_1).value.first._M_string_length = (key->first)._M_string_length;
        (key->first)._M_dataplus._M_p = (pointer)paVar1;
        (key->first)._M_string_length = 0;
        (key->first).field_2._M_local_buf[0] = '\0';
        (current_entry->field_1).value.second._M_t.
        super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
        ._M_t.
        super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
        .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl =
             (key->second)._M_t.
             super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
             ._M_t.
             super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
             .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl;
        (key->second)._M_t.
        super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
        ._M_t.
        super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
        .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl =
             (FileData *)0x0;
        current_entry->distance_from_desired = distance_from_desired;
        *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
        uVar11 = CONCAT71(uVar12,1);
      }
      else {
        local_60._0_8_ = local_60 + 0x10;
        pcVar3 = (key->first)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 == paVar1) {
          local_60._16_8_ = paVar1->_M_allocated_capacity;
          local_60._24_8_ = *(undefined8 *)((long)&(key->first).field_2 + 8);
        }
        else {
          local_60._16_8_ = paVar1->_M_allocated_capacity;
          local_60._0_8_ = pcVar3;
        }
        local_60._8_8_ = (key->first)._M_string_length;
        (key->first)._M_dataplus._M_p = (pointer)paVar1;
        (key->first)._M_string_length = 0;
        (key->first).field_2._M_local_buf[0] = '\0';
        local_40._M_head_impl =
             (key->second)._M_t.
             super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
             ._M_t.
             super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
             .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl;
        (key->second)._M_t.
        super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
        ._M_t.
        super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
        .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl =
             (FileData *)0x0;
        cVar10 = current_entry->distance_from_desired;
        current_entry->distance_from_desired = distance_from_desired;
        local_38 = &current_entry->field_1;
        std::__cxx11::string::swap((string *)local_60);
        tVar4.
        super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
        .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
              )(current_entry->field_1).value.second._M_t.
               super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
               .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl;
        (current_entry->field_1).value.second._M_t.
        super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
        ._M_t.
        super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
        .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl =
             local_40._M_head_impl;
        sVar14 = (sherwood_v3_table<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>>>
                  )(cVar10 + '\x01');
        psVar13 = current_entry + 1;
        cVar10 = current_entry[1].distance_from_desired;
        psVar8 = current_entry;
        local_40._M_head_impl =
             (FileData *)
             tVar4.
             super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
             .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl;
        if (-1 < cVar10) {
          do {
            psVar8 = psVar13;
            if (cVar10 < (char)sVar14) {
              psVar8->distance_from_desired = (int8_t)sVar14;
              std::__cxx11::string::swap((string *)local_60);
              _Var5.super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl =
                   (_Head_base<0UL,_slang::SourceManager::FileData_*,_false>)
                   (psVar8->field_1).value.second._M_t.
                   super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
                   .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl;
              (psVar8->field_1).value.second._M_t.
              super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
              ._M_t.
              super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
              .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl =
                   local_40._M_head_impl;
              sVar14 = (sherwood_v3_table<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>>>
                        )(cVar10 + '\x01');
              local_40._M_head_impl =
                   (FileData *)
                   _Var5.super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl
              ;
            }
            else {
              sVar14 = (sherwood_v3_table<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>>>
                        )((char)sVar14 + '\x01');
              if (sVar14 == this[0x11]) {
                std::__cxx11::string::swap((string *)local_60);
                tVar4.
                super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
                .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl =
                     (_Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
                      )(current_entry->field_1).value.second._M_t.
                       super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
                       .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl;
                (current_entry->field_1).value.second._M_t.
                super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
                ._M_t.
                super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
                .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl =
                     local_40._M_head_impl;
                local_40._M_head_impl =
                     (FileData *)
                     tVar4.
                     super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
                     .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl;
                sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>_>_>
                ::grow((sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>_>_>
                        *)this);
                pVar17 = emplace<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>
                                   (this,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>
                                          *)local_60);
                current_entry = (EntryPointer)pVar17.first.current;
                uVar11 = (ulong)pVar17._8_4_;
                goto LAB_001ad334;
              }
            }
            cVar10 = psVar8[1].distance_from_desired;
            psVar13 = psVar8 + 1;
          } while (-1 < cVar10);
        }
        paVar1 = &psVar8[1].field_1.value.first.field_2;
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)&psVar8[1].field_1 = paVar1;
        if ((undefined1 *)local_60._0_8_ == local_60 + 0x10) {
          paVar1->_M_allocated_capacity = local_60._16_8_;
          *(undefined8 *)((long)&psVar8[1].field_1.value.first.field_2 + 8) = local_60._24_8_;
        }
        else {
          psVar8[1].field_1.value.first._M_dataplus._M_p = (pointer)local_60._0_8_;
          psVar8[1].field_1.value.first.field_2._M_allocated_capacity = local_60._16_8_;
        }
        psVar8[1].field_1.value.first._M_string_length = local_60._8_8_;
        local_60._8_8_ = 0;
        local_60._16_8_ = local_60._16_8_ & 0xffffffffffffff00;
        psVar8[1].field_1.value.second._M_t.
        super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
        ._M_t.
        super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
        .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl =
             local_40._M_head_impl;
        local_40._M_head_impl = (FileData *)0x0;
        psVar13->distance_from_desired = (int8_t)sVar14;
        *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
        uVar11 = CONCAT71(uVar12,1);
        local_60._0_8_ = local_60 + 0x10;
LAB_001ad334:
        if ((_Head_base<0UL,_slang::SourceManager::FileData_*,_false>)local_40._M_head_impl !=
            (_Head_base<0UL,_slang::SourceManager::FileData_*,_false>)0x0) {
          std::default_delete<slang::SourceManager::FileData>::operator()
                    ((default_delete<slang::SourceManager::FileData> *)&local_40,
                     local_40._M_head_impl);
        }
        local_40._M_head_impl = (FileData *)0x0;
        if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
          operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
        }
      }
      goto LAB_001ad12e;
    }
  }
  sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>_>_>
  ::grow((sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>_>_>
          *)this);
  pVar17 = emplace<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>
                     (this,key);
  current_entry = (EntryPointer)pVar17.first.current;
  uVar11 = (ulong)pVar17._8_4_;
LAB_001ad12e:
  pVar17._8_8_ = uVar11 & 0xffffffff;
  pVar17.first.current = current_entry;
  return pVar17;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }